

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data.cpp
# Opt level: O2

shared_ptr<duckdb::ColumnData,_true> __thiscall
duckdb::ColumnData::Deserialize
          (ColumnData *this,BlockManager *block_manager,DataTableInfo *info,idx_t column_index,
          idx_t start_row,ReadStream *source,LogicalType *type)

{
  SerializationData *this_00;
  ColumnData *pCVar1;
  ColumnData *pCVar2;
  pointer pSVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<duckdb::ColumnData,_true> sVar4;
  CompressionInfo compression_info;
  PersistentColumnData persistent_column_data;
  BinaryDeserializer deserializer;
  CompressionInfo local_300;
  PersistentColumnData local_2f8;
  undefined1 local_2b8 [416];
  deque<std::reference_wrapper<duckdb::LogicalType_const>,std::allocator<std::reference_wrapper<duckdb::LogicalType_const>>>
  local_118 [80];
  deque<std::reference_wrapper<duckdb::CompressionInfo_const>,std::allocator<std::reference_wrapper<duckdb::CompressionInfo_const>>>
  local_c8 [160];
  
  CreateColumn(this,block_manager,info,column_index,start_row,
               (LogicalType *)compression_info.block_manager,
               (optional_ptr<duckdb::ColumnData,_true>)0x0);
  BinaryDeserializer::BinaryDeserializer((BinaryDeserializer *)local_2b8,source);
  BinaryDeserializer::OnObjectBegin((BinaryDeserializer *)local_2b8);
  ::std::
  deque<std::reference_wrapper<duckdb::DatabaseInstance>,std::allocator<std::reference_wrapper<duckdb::DatabaseInstance>>>
  ::emplace_back<duckdb::DatabaseInstance&>
            ((deque<std::reference_wrapper<duckdb::DatabaseInstance>,std::allocator<std::reference_wrapper<duckdb::DatabaseInstance>>>
              *)(local_2b8 + 0x60),info->db->db);
  local_300.block_manager = block_manager;
  ::std::
  deque<std::reference_wrapper<duckdb::CompressionInfo_const>,std::allocator<std::reference_wrapper<duckdb::CompressionInfo_const>>>
  ::emplace_back<duckdb::CompressionInfo_const&>(local_c8,&local_300);
  ::std::
  deque<std::reference_wrapper<duckdb::LogicalType_const>,std::allocator<std::reference_wrapper<duckdb::LogicalType_const>>>
  ::emplace_back<duckdb::LogicalType_const&>
            (local_118,(LogicalType *)compression_info.block_manager);
  PersistentColumnData::Deserialize(&local_2f8,(Deserializer *)local_2b8);
  this_00 = (SerializationData *)(local_2b8 + 0x10);
  SerializationData::Unset<duckdb::LogicalType>(this_00);
  SerializationData::Unset<duckdb::CompressionInfo_const>(this_00);
  SerializationData::Unset<duckdb::DatabaseInstance>(this_00);
  BinaryDeserializer::OnObjectEnd((BinaryDeserializer *)local_2b8);
  pCVar1 = shared_ptr<duckdb::ColumnData,_true>::operator->
                     ((shared_ptr<duckdb::ColumnData,_true> *)this);
  pCVar2 = shared_ptr<duckdb::ColumnData,_true>::operator->
                     ((shared_ptr<duckdb::ColumnData,_true> *)this);
  pSVar3 = unique_ptr<duckdb::SegmentStatistics,_std::default_delete<duckdb::SegmentStatistics>,_true>
           ::operator->(&pCVar2->stats);
  (*pCVar1->_vptr_ColumnData[0x20])(pCVar1,&local_2f8,pSVar3);
  PersistentColumnData::~PersistentColumnData(&local_2f8);
  Deserializer::~Deserializer((Deserializer *)local_2b8);
  sVar4.internal.super___shared_ptr<duckdb::ColumnData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  sVar4.internal.super___shared_ptr<duckdb::ColumnData,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<duckdb::ColumnData,_true>)
         sVar4.internal.super___shared_ptr<duckdb::ColumnData,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<ColumnData> ColumnData::Deserialize(BlockManager &block_manager, DataTableInfo &info, idx_t column_index,
                                               idx_t start_row, ReadStream &source, const LogicalType &type) {
	auto entry = ColumnData::CreateColumn(block_manager, info, column_index, start_row, type, nullptr);

	// deserialize the persistent column data
	BinaryDeserializer deserializer(source);
	deserializer.Begin();
	deserializer.Set<DatabaseInstance &>(info.GetDB().GetDatabase());
	CompressionInfo compression_info(block_manager);
	deserializer.Set<const CompressionInfo &>(compression_info);
	deserializer.Set<const LogicalType &>(type);
	auto persistent_column_data = PersistentColumnData::Deserialize(deserializer);
	deserializer.Unset<LogicalType>();
	deserializer.Unset<const CompressionInfo>();
	deserializer.Unset<DatabaseInstance>();
	deserializer.End();

	// initialize the column
	entry->InitializeColumn(persistent_column_data, entry->stats->statistics);
	return entry;
}